

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O0

void virtio_legacy_init(virtio_device *dev)

{
  uint8_t uVar1;
  uint32_t uVar2;
  uint32_t required_features;
  uint32_t host_features;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  undefined8 in_stack_ffffffffffffffe0;
  FILE *pFVar3;
  
  fprintf(_stderr,"[DEBUG] %s:%d %s(): Configuring bar0\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
          0x113,"virtio_legacy_init");
  write_io8((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
            (uint8_t)((ulong)in_stack_ffffffffffffffe0 >> 0x18),
            CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  while( true ) {
    uVar1 = read_io8((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                     CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    if (uVar1 == '\0') break;
    usleep(100);
  }
  write_io8((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
            (uint8_t)((ulong)in_stack_ffffffffffffffe0 >> 0x18),
            CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  write_io8((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
            (uint8_t)((ulong)in_stack_ffffffffffffffe0 >> 0x18),
            CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  uVar2 = read_io32((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                    CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  fprintf(_stderr,"[DEBUG] %s:%d %s(): Host features: %x\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
          0x11c,"virtio_legacy_init",(ulong)uVar2);
  pFVar3 = _stderr;
  if ((uVar2 & 0x8060003) != 0x8060003) {
    fprintf(_stderr,"[ERROR] %s:%d %s(): Device does not support required features\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x121,"virtio_legacy_init");
    abort();
  }
  uVar2 = read_io32((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                    CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  fprintf(pFVar3,"[DEBUG] %s:%d %s(): Guest features before negotiation: %x\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
          0x123,"virtio_legacy_init",(ulong)uVar2);
  write_io32((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),(uint32_t)in_stack_ffffffffffffffe0,
             CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  pFVar3 = _stderr;
  uVar2 = read_io32((int)((ulong)_stderr >> 0x20),
                    CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  fprintf(pFVar3,"[DEBUG] %s:%d %s(): Guest features after negotiation: %x\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
          0x125,"virtio_legacy_init",(ulong)uVar2);
  virtio_legacy_setup_rx_queue(dev,host_features._2_2_);
  virtio_legacy_setup_tx_queue(dev,host_features._2_2_);
  virtio_legacy_setup_tx_queue(dev,host_features._2_2_);
  write_io8((int)((ulong)pFVar3 >> 0x20),(uint8_t)((ulong)pFVar3 >> 0x18),
            CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  fprintf(_stdout,"[INFO ] %s:%d %s(): Setup complete\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
          0x12e,"virtio_legacy_init");
  virtio_legacy_check_status((virtio_device *)0x107d21);
  virtio_legacy_set_promiscuous((virtio_device *)pFVar3,(_Bool)in_stack_ffffffffffffffdf);
  return;
}

Assistant:

static void virtio_legacy_init(struct virtio_device* dev) {
	// Section 3.1
	debug("Configuring bar0");
	write_io8(dev->fd, VIRTIO_CONFIG_STATUS_RESET, VIRTIO_PCI_STATUS);
	while (read_io8(dev->fd, VIRTIO_PCI_STATUS) != VIRTIO_CONFIG_STATUS_RESET) {
		usleep(100);
	}
	write_io8(dev->fd, VIRTIO_CONFIG_STATUS_ACK, VIRTIO_PCI_STATUS);
	write_io8(dev->fd, VIRTIO_CONFIG_STATUS_DRIVER, VIRTIO_PCI_STATUS);
	// Negotiate features
	uint32_t host_features = read_io32(dev->fd, VIRTIO_PCI_HOST_FEATURES);
	debug("Host features: %x", host_features);
	const uint32_t required_features = (1u << VIRTIO_NET_F_CSUM) | (1u << VIRTIO_NET_F_GUEST_CSUM) |
					   (1u << VIRTIO_NET_F_CTRL_VQ) | (1u << VIRTIO_F_ANY_LAYOUT) |
					   (1u << VIRTIO_NET_F_CTRL_RX) /*| (1u<<VIRTIO_NET_F_MQ)*/;
	if ((host_features & required_features) != required_features) {
		error("Device does not support required features");
	}
	debug("Guest features before negotiation: %x", read_io32(dev->fd, VIRTIO_PCI_GUEST_FEATURES));
	write_io32(dev->fd, required_features, VIRTIO_PCI_GUEST_FEATURES);
	debug("Guest features after negotiation: %x", read_io32(dev->fd, VIRTIO_PCI_GUEST_FEATURES));
	// Queue setup - Section 5.1.2 for queue index calculation
	// Legacy devices only have 3 queues
	virtio_legacy_setup_rx_queue(dev, 0); // Rx
	virtio_legacy_setup_tx_queue(dev, 1); // Tx
	virtio_legacy_setup_tx_queue(dev, 2); // Control
	_mm_mfence();
	// Signal OK
	write_io8(dev->fd, VIRTIO_CONFIG_STATUS_DRIVER_OK, VIRTIO_PCI_STATUS);
	info("Setup complete");
	// Recheck status
	virtio_legacy_check_status(dev);
	virtio_legacy_set_promiscuous(dev, true);
}